

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# npy.h
# Opt level: O0

string * npy::pyparse::write_tuple<unsigned_long>
                   (string *__return_storage_ptr__,
                   vector<unsigned_long,_std::allocator<unsigned_long>_> *v)

{
  size_type sVar1;
  ostream *poVar2;
  const_reference pvVar3;
  char *__c;
  undefined1 local_208 [16];
  ostream_iterator<unsigned_long,_char,_std::char_traits<char>_> local_1f8;
  __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_1e8;
  ostream_iterator<unsigned_long,_char,_std::char_traits<char>_> *local_1e0;
  __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_1d8;
  allocator local_1c9;
  string local_1c8 [8];
  string delimiter;
  ostringstream ss;
  allocator local_19;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_18;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *v_local;
  
  local_18 = v;
  v_local = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)__return_storage_ptr__;
  sVar1 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(v);
  if (sVar1 == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"",&local_19);
    std::allocator<char>::~allocator((allocator<char> *)&local_19);
  }
  else {
    std::__cxx11::ostringstream::ostringstream
              ((ostringstream *)(delimiter.field_2._M_local_buf + 8));
    sVar1 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(local_18);
    if (sVar1 == 1) {
      poVar2 = std::operator<<((ostream *)(delimiter.field_2._M_local_buf + 8),"(");
      pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::front(local_18);
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,*pvVar3);
      std::operator<<(poVar2,",)");
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_1c8,", ",&local_1c9);
      std::allocator<char>::~allocator((allocator<char> *)&local_1c9);
      std::operator<<((ostream *)(delimiter.field_2._M_local_buf + 8),"(");
      local_1d8._M_current =
           (unsigned_long *)
           std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin(local_18);
      local_1e8._M_current =
           (unsigned_long *)
           std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end(local_18);
      local_1e0 = (ostream_iterator<unsigned_long,_char,_std::char_traits<char>_> *)
                  __gnu_cxx::
                  __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                  ::operator-(&local_1e8,1);
      __c = (char *)std::__cxx11::string::c_str();
      std::ostream_iterator<unsigned_long,_char,_std::char_traits<char>_>::ostream_iterator
                (&local_1f8,(ostream_type *)(delimiter.field_2._M_local_buf + 8),__c);
      std::
      copy<__gnu_cxx::__normal_iterator<unsigned_long_const*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,std::ostream_iterator<unsigned_long,char,std::char_traits<char>>>
                ((__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                  )local_208,local_1d8,local_1e0);
      pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::back(local_18);
      std::ostream::operator<<((ostream *)(delimiter.field_2._M_local_buf + 8),*pvVar3);
      std::operator<<((ostream *)(delimiter.field_2._M_local_buf + 8),")");
      std::__cxx11::string::~string(local_1c8);
    }
    std::__cxx11::ostringstream::str();
    std::__cxx11::ostringstream::~ostringstream
              ((ostringstream *)(delimiter.field_2._M_local_buf + 8));
  }
  return __return_storage_ptr__;
}

Assistant:

inline std::string write_tuple(const std::vector<T> &v)
{
    if (v.size() == 0)
        return "";

    std::ostringstream ss;

    if (v.size() == 1)
    {
        ss << "(" << v.front() << ",)";
    }
    else
    {
        const std::string delimiter = ", ";
        // v.size() > 1
        ss << "(";
        std::copy(v.begin(), v.end() - 1, std::ostream_iterator<T>(ss, delimiter.c_str()));
        ss << v.back();
        ss << ")";
    }

    return ss.str();
}